

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall level_tools::paint_automatic(level_tools *this,xr_surface *surface,uint16_t flags)

{
  bool bVar1;
  char *lname;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  string *psVar7;
  char *p;
  char *preset;
  char *gamemtl;
  uint16_t flags_local;
  xr_surface *surface_local;
  level_tools *this_local;
  
  xray_re::xr_surface::gamemtl_abi_cxx11_(surface);
  lname = (char *)std::__cxx11::string::c_str();
  bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,"collider_presets",lname);
  if (bVar1) {
    pcVar2 = xray_re::xr_ini_file::r_string(this->m_ini,"collider_presets",lname);
    pcVar3 = scan_value(pcVar2);
    if (pcVar3 == pcVar2) {
      __assert_fail("p != preset",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x399,"void level_tools::paint_automatic(xr_surface *, uint16_t) const");
    }
    psVar7 = xray_re::xr_surface::texture_abi_cxx11_(surface);
    std::__cxx11::string::assign((char *)psVar7,(ulong)pcVar2);
    pcVar2 = skip_comma(pcVar3);
    if ((pcVar2 != (char *)0x0) && (pcVar3 = scan_value(pcVar2), pcVar3 != pcVar2)) {
      psVar7 = xray_re::xr_surface::eshader_abi_cxx11_(surface);
      std::__cxx11::string::assign((char *)psVar7,(ulong)pcVar2);
      pcVar2 = skip_comma(pcVar3);
      if ((pcVar2 != (char *)0x0) && (pcVar3 = scan_value(pcVar2), pcVar3 != pcVar2)) {
        psVar7 = xray_re::xr_surface::cshader_abi_cxx11_(surface);
        std::__cxx11::string::assign((char *)psVar7,(ulong)pcVar2);
        xray_re::xr_surface::texture_abi_cxx11_(surface);
        uVar4 = std::__cxx11::string::c_str();
        xray_re::xr_surface::eshader_abi_cxx11_(surface);
        uVar5 = std::__cxx11::string::c_str();
        xray_re::xr_surface::cshader_abi_cxx11_(surface);
        uVar6 = std::__cxx11::string::c_str();
        xray_re::msg("%s -> %s, %s, %s",lname,uVar4,uVar5,uVar6);
      }
    }
  }
  else {
    xray_re::msg("no invisible collider preset for game material %s",lname);
    psVar7 = xray_re::xr_surface::texture_abi_cxx11_(surface);
    std::__cxx11::string::operator=((string *)psVar7,"prop\\prop_fake_kollision");
    psVar7 = xray_re::xr_surface::eshader_abi_cxx11_(surface);
    std::__cxx11::string::operator=((string *)psVar7,"def_shaders\\def_vertex");
  }
  return;
}

Assistant:

void level_tools::paint_automatic(xr_surface* surface, uint16_t flags) const
{
	const char* gamemtl = surface->gamemtl().c_str();
	if (m_ini->line_exist("collider_presets", gamemtl)) {
		const char* preset = m_ini->r_string("collider_presets", gamemtl);

		const char* p = scan_value(preset);
		xr_assert(p != preset);
		surface->texture().assign(preset, p - preset);

		if ((p = skip_comma(p)) == 0)
			return;
		if ((p = scan_value(preset = p)) == preset)
			return;
		surface->eshader().assign(preset, p - preset);

		if ((p = skip_comma(p)) == 0)
			return;
		if ((p = scan_value(preset = p)) == preset)
			return;
		surface->cshader().assign(preset, p - preset);

		msg("%s -> %s, %s, %s", gamemtl,
				surface->texture().c_str(), surface->eshader().c_str(),
				surface->cshader().c_str());
	} else {
		msg("no invisible collider preset for game material %s", gamemtl);
		surface->texture() = "prop\\prop_fake_kollision";
		surface->eshader() = "def_shaders\\def_vertex";
	}
}